

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AudioPluginUtil.cpp
# Opt level: O0

void __thiscall
FFTAnalyzer::ReadBuffer(FFTAnalyzer *this,float *buffer,int numsamples,bool readInputBuffer)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  float x;
  float *local_48;
  int i;
  float f;
  int n;
  float scale;
  float *buf;
  bool readInputBuffer_local;
  int numsamples_local;
  float *buffer_local;
  FFTAnalyzer *this_local;
  
  bVar2 = CanBeRead(this);
  if (bVar2) {
    buf._4_4_ = numsamples;
    if (this->spectrumSize < numsamples) {
      buf._4_4_ = this->spectrumSize;
    }
    if (readInputBuffer) {
      local_48 = this->ispec2;
    }
    else {
      local_48 = this->ospec2;
    }
    iVar1 = this->spectrumSize;
    for (i = 0; i < buf._4_4_; i = i + 1) {
      x = (float)i * ((float)(iVar1 / 2 + -2) / (float)(buf._4_4_ + -1));
      iVar3 = FastFloor(x);
      buffer[i] = (local_48[iVar3 + 1] - local_48[iVar3]) * (x - (float)iVar3) + local_48[iVar3];
    }
  }
  else {
    memset(buffer,0,(long)numsamples << 2);
  }
  return;
}

Assistant:

void FFTAnalyzer::ReadBuffer(float* buffer, int numsamples, bool readInputBuffer)
{
    if (!CanBeRead())
    {
        memset(buffer, 0, sizeof(float) * numsamples);
        return;
    }
    if (numsamples > spectrumSize)
        numsamples = spectrumSize;
    float* buf = (readInputBuffer) ? ispec2 : ospec2;
    float scale = (float)((spectrumSize / 2) - 2) / (float)(numsamples - 1);
    for (int n = 0; n < numsamples; n++)
    {
        float f = n * scale;
        int i = FastFloor(f);
        buffer[n] = buf[i] + (buf[i + 1] - buf[i]) * (f - i);
    }
}